

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

void Abc_SclShortFormula(SC_Cell *pCell,char *pForm,char *pBuffer)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  byte *pbVar5;
  size_t __n;
  int iVar6;
  byte *local_40;
  byte *local_38;
  
  bVar2 = *pForm;
  local_40 = (byte *)pBuffer;
  local_38 = (byte *)pForm;
  do {
    if (bVar2 == 0) {
      *local_40 = 0;
      return;
    }
    if ((bVar2 == 0x5f) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
      pbVar5 = local_38 + -1;
      __n = 0xffffffffffffffff;
      do {
        do {
          bVar2 = pbVar5[1];
          pbVar5 = pbVar5 + 1;
          __n = __n + 1;
        } while (bVar2 == 0x5f);
      } while ((0xf5 < (byte)(bVar2 - 0x3a)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
      iVar6 = pCell->n_inputs;
      if ((long)iVar6 < 1) {
        uVar4 = 0;
      }
      else {
        uVar1 = (pCell->vPins).nSize;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        uVar4 = 0;
        while( true ) {
          if (uVar1 == uVar4) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar3 = strncmp(*(pCell->vPins).pArray[uVar4],(char *)local_38,__n);
          if (iVar3 == 0) break;
          uVar4 = uVar4 + 1;
          if ((long)iVar6 == uVar4) goto LAB_00469e79;
        }
        *local_40 = (char)uVar4 + 0x61;
        local_40 = local_40 + 1;
        iVar6 = pCell->n_inputs;
      }
      if (iVar6 <= (int)uVar4) {
LAB_00469e79:
        __assert_fail("i < pCell->n_inputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibUtil.c"
                      ,0x96,"void Abc_SclShortFormula(SC_Cell *, char *, char *)");
      }
    }
    else {
      pbVar5 = local_38 + 1;
      *local_40 = bVar2;
      local_40 = local_40 + 1;
    }
    bVar2 = *pbVar5;
    local_38 = pbVar5;
  } while( true );
}

Assistant:

void Abc_SclShortFormula( SC_Cell * pCell, char * pForm, char * pBuffer )
{
    SC_Pin * pPin; int i;
    char * pTemp, * pLimit;
    for ( pTemp = pForm; *pTemp; )
    {
        if ( !Abc_SclIsChar(*pTemp) )
        {
            *pBuffer++ = *pTemp++;
            continue;
        }
        pLimit = Abc_SclFindLimit( pTemp );
        SC_CellForEachPinIn( pCell, pPin, i )
            if ( Abc_SclAreEqual( pPin->pName, pTemp, pLimit ) )
            {
                *pBuffer++ = 'a' + i;
                break;
            }
        assert( i < pCell->n_inputs );
        pTemp = pLimit;
    }
    *pBuffer++ = 0;
}